

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashmap.cpp
# Opt level: O0

void lsvm::hashmap::copy_into_new_bucket
               (hashmap *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  entry *b_00;
  entry *peVar1;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  long in_RDI;
  entry *ehe;
  entry *he;
  hashbucket *ob;
  void *in_stack_00000038;
  uint16_t in_stack_00000046;
  hash in_stack_00000048;
  hashmap *in_stack_00000050;
  undefined8 in_stack_ffffffffffffffc8;
  uint32_t indx;
  undefined8 in_stack_ffffffffffffffd0;
  hashbucket *b_01;
  undefined4 in_stack_ffffffffffffffe0;
  
  indx = (uint32_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  b_01 = (hashbucket *)*in_RDX;
  *in_RDX = *(undefined8 *)*in_RDX;
  add_new_bucket((hashmap *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(hashbucket **)b_01,
                 (uint8_t)((ulong)in_stack_ffffffffffffffd0 >> 0x38));
  *(uint32_t *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) - b_01->count;
  balance_partition((hashbucket **)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  b_00 = entries(b_01);
  peVar1 = get_entry((hashbucket *)b_00,indx);
  for (; b_00 <= peVar1; b_00 = b_00 + 1) {
    if (b_00->key != (void *)0x0) {
      insert_into_partition
                (in_stack_00000050,in_stack_00000048,in_stack_00000046,in_stack_00000038,h,pb._7_1_)
      ;
    }
  }
  memory::retain(b_00);
  balance_partition((hashbucket **)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
  return;
}

Assistant:

inline void copy_into_new_bucket(hashmap* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->key != null){
            insert_into_partition(h,he->keyhash,hashbit(he->keyhash,h->bits),he->key,he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}